

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::sync_weights(vw *all)

{
  float fVar1;
  double dVar2;
  _Hash_node_base *p_Var3;
  weight *pwVar4;
  uint64_t uVar5;
  uint32_t uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  dVar2 = all->sd->gravity;
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar2 = all->sd->contraction, dVar2 == 1.0)) &&
     (!NAN(dVar2))) {
    return;
  }
  if ((all->weights).sparse == true) {
    for (p_Var3 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
        p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      fVar1 = *(float *)&(p_Var3[2]._M_nxt)->_M_nxt;
      fVar8 = (float)all->sd->gravity;
      fVar9 = 0.0;
      if (fVar8 < ABS(fVar1)) {
        fVar9 = fVar8 * *(float *)(&DAT_0027eba8 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
      }
      *(float *)&(p_Var3[2]._M_nxt)->_M_nxt = (float)all->sd->contraction * fVar9;
    }
  }
  else {
    pwVar4 = (all->weights).dense_weights._begin;
    uVar5 = (all->weights).dense_weights._weight_mask;
    if (pwVar4 != pwVar4 + uVar5 + 1) {
      uVar6 = (all->weights).dense_weights._stride_shift;
      lVar7 = 0;
      do {
        fVar1 = *(float *)((long)pwVar4 + lVar7);
        fVar8 = (float)all->sd->gravity;
        fVar9 = 0.0;
        if (fVar8 < ABS(fVar1)) {
          fVar9 = fVar8 * *(float *)(&DAT_0027eba8 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
        }
        *(float *)((long)pwVar4 + lVar7) = (float)all->sd->contraction * fVar9;
        lVar7 = lVar7 + (1L << ((byte)uVar6 & 0x3f)) * 4;
      } while (uVar5 * 4 + 4 != lVar7);
    }
  }
  all->sd->gravity = 0.0;
  all->sd->contraction = 1.0;
  return;
}

Assistant:

void sync_weights(vw& all)
{
  // todo, fix length dependence
  if (all.sd->gravity == 0. && all.sd->contraction == 1.)  // to avoid unnecessary weight synchronization
    return;

  if (all.weights.sparse)
    for (weight& w : all.weights.sparse_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;
  else
    for (weight& w : all.weights.dense_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;

  all.sd->gravity = 0.;
  all.sd->contraction = 1.;
}